

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

thread_record * __thiscall
cds::urcu::details::thread_list<cds::urcu::general_buffered_tag,_std::allocator<int>_>::alloc
          (thread_list<cds::urcu::general_buffered_tag,_std::allocator<int>_> *this)

{
  atomic<unsigned_long> *paVar1;
  pthread_t pVar2;
  thread_record *ptVar3;
  thread_data<cds::urcu::general_buffered_tag> *ptVar4;
  value_type *pv;
  bool bVar6;
  thread_data<cds::urcu::general_buffered_tag> *ptVar5;
  
  pVar2 = pthread_self();
  ptVar3 = *(thread_record **)this;
  while( true ) {
    if (ptVar3 == (thread_record *)0x0) {
      ptVar3 = (thread_record *)operator_new(0x58);
      (ptVar3->m_nAccessControl).super___atomic_base<unsigned_int>._M_i = 0;
      (ptVar3->m_list).next_ = (thread_data<cds::urcu::general_buffered_tag> *)0x0;
      (ptVar3->m_list).thread_id_.super___atomic_base<unsigned_long>._M_i = pVar2;
      ptVar5 = *(thread_data<cds::urcu::general_buffered_tag> **)this;
      (ptVar3->m_list).next_ = ptVar5;
      while( true ) {
        LOCK();
        ptVar4 = *(thread_data<cds::urcu::general_buffered_tag> **)this;
        bVar6 = ptVar5 == ptVar4;
        if (bVar6) {
          *(thread_record **)this = ptVar3;
          ptVar4 = ptVar5;
        }
        UNLOCK();
        if (bVar6) break;
        (ptVar3->m_list).next_ = ptVar4;
        ptVar5 = ptVar4;
      }
      return ptVar3;
    }
    paVar1 = &(ptVar3->m_list).thread_id_;
    LOCK();
    bVar6 = (paVar1->super___atomic_base<unsigned_long>)._M_i == 0;
    if (bVar6) {
      (paVar1->super___atomic_base<unsigned_long>)._M_i = pVar2;
    }
    UNLOCK();
    if (bVar6) break;
    ptVar3 = (ptVar3->m_list).next_;
  }
  return ptVar3;
}

Assistant:

thread_record * alloc()
                {
                    thread_record * pRec;
                    cds::OS::ThreadId const nullThreadId = cds::OS::c_NullThreadId;
                    cds::OS::ThreadId const curThreadId  = cds::OS::get_current_thread_id();

                    // First, try to reuse a retired (non-active) HP record
                    for ( pRec = m_pHead.load( atomics::memory_order_acquire ); pRec; pRec = pRec->m_list.next_ ) {
                        cds::OS::ThreadId thId = nullThreadId;
                        if ( !pRec->m_list.thread_id_.compare_exchange_strong( thId, curThreadId, atomics::memory_order_acquire, atomics::memory_order_relaxed ))
                            continue;
                        return pRec;
                    }

                    // No records available for reuse
                    // Allocate and push a new record
                    pRec = allocator_type().New( curThreadId );

                    thread_record * pOldHead = m_pHead.load( atomics::memory_order_acquire );
                    do {
                        // Compiler barriers: assignment MUST BE inside the loop
                        CDS_COMPILER_RW_BARRIER;
                        pRec->m_list.next_ = pOldHead;
                        CDS_COMPILER_RW_BARRIER;
                    } while ( !m_pHead.compare_exchange_weak( pOldHead, pRec, atomics::memory_order_release, atomics::memory_order_acquire ));

                    return pRec;
                }